

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

void * stbiw__sbgrowf(void **arr,int increment,int itemsize)

{
  void *pvVar1;
  void *local_38;
  int local_2c;
  void *p;
  int m;
  int itemsize_local;
  int increment_local;
  void **arr_local;
  
  if (*arr == (void *)0x0) {
    local_2c = increment + 1;
  }
  else {
    local_2c = *(int *)((long)*arr + -8) * 2 + increment;
  }
  if (*arr == (void *)0x0) {
    local_38 = (void *)0x0;
  }
  else {
    local_38 = (void *)((long)*arr + -8);
  }
  pvVar1 = realloc(local_38,(long)(itemsize * local_2c) + 8);
  if (pvVar1 != (void *)0x0) {
    if (pvVar1 != (void *)0x0) {
      if (*arr == (void *)0x0) {
        *(undefined4 *)((long)pvVar1 + 4) = 0;
      }
      *arr = (void *)((long)pvVar1 + 8);
      *(int *)((long)*arr + -8) = local_2c;
    }
    return *arr;
  }
  __assert_fail("p",
                "/workspace/llm4binary/github/license_all_cmakelists_25/footballhead[P]explorer-utils/stb_image_write/stb_image_write.h"
                ,0x331,"void *stbiw__sbgrowf(void **, int, int)");
}

Assistant:

static void *stbiw__sbgrowf(void **arr, int increment, int itemsize)
{
   int m = *arr ? 2*stbiw__sbm(*arr)+increment : increment+1;
   void *p = STBIW_REALLOC_SIZED(*arr ? stbiw__sbraw(*arr) : 0, *arr ? (stbiw__sbm(*arr)*itemsize + sizeof(int)*2) : 0, itemsize * m + sizeof(int)*2);
   STBIW_ASSERT(p);
   if (p) {
      if (!*arr) ((int *) p)[1] = 0;
      *arr = (void *) ((int *) p + 2);
      stbiw__sbm(*arr) = m;
   }
   return *arr;
}